

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTriangleSphere.h
# Opt level: O0

void __thiscall
pzgeom::TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>>::X<Fad<double>>
          (TPZTriangleSphere<pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>_> *this,
          TPZFMatrix<double> *cornerco,TPZVec<Fad<double>_> *loc,TPZVec<Fad<double>_> *result)

{
  TPZVec<Fad<double>_> *in_RCX;
  Fad<double> *in_RDI;
  int i_1;
  TPZManVector<Fad<double>,_3> Xsphere;
  int i;
  Fad<double> NormValue;
  TPZManVector<double,_3> Xc;
  TPZManVector<Fad<double>,_3> XtminusXc;
  TPZManVector<Fad<double>,_3> xqsi;
  TPZVec<Fad<double>_> *in_stack_00001938;
  TPZVec<Fad<double>_> *in_stack_00001940;
  TPZFMatrix<double> *in_stack_00001948;
  TPZGeoBlend<pzgeom::TPZGeoTriangle> *in_stack_00001950;
  TPZManVector<double,_3> *in_stack_fffffffffffffca0;
  Fad<double> *in_stack_fffffffffffffca8;
  TPZManVector<Fad<double>,_3> *in_stack_fffffffffffffcb0;
  FadExpr<FadFuncSqrt<Fad<double>_>_> *in_stack_fffffffffffffcb8;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *x;
  Fad<double> *in_stack_fffffffffffffcd0;
  TPZVec<double> *in_stack_fffffffffffffcd8;
  TPZManVector<double,_3> *in_stack_fffffffffffffce0;
  double in_stack_fffffffffffffce8;
  double in_stack_fffffffffffffcf0;
  Fad<double> *in_stack_fffffffffffffcf8;
  int local_2e4;
  Fad<double> *in_stack_fffffffffffffd40;
  int64_t in_stack_fffffffffffffd48;
  TPZManVector<Fad<double>,_3> *in_stack_fffffffffffffd50;
  int local_1e4;
  TPZVec<double> local_1b8;
  undefined8 local_180;
  TPZManVector<double,_3> local_158 [2];
  undefined8 local_c8;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_c0 [2];
  TPZVec<Fad<double>_> local_a0 [4];
  TPZVec<Fad<double>_> *local_20;
  
  local_c8 = 0;
  x = local_c0;
  local_20 = in_RCX;
  Fad<double>::Fad<double,_nullptr>
            ((Fad<double> *)in_stack_fffffffffffffcb0,&in_stack_fffffffffffffca8->val_);
  TPZManVector<Fad<double>,_3>::TPZManVector
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffffca0);
  local_180 = 0;
  Fad<double>::Fad<double,_nullptr>
            ((Fad<double> *)in_stack_fffffffffffffcb0,&in_stack_fffffffffffffca8->val_);
  TPZManVector<Fad<double>,_3>::TPZManVector
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffffca0);
  TPZGeoBlend<pzgeom::TPZGeoTriangle>::X<Fad<double>>
            (in_stack_00001950,in_stack_00001948,in_stack_00001940,in_stack_00001938);
  TPZManVector<double,_3>::TPZManVector(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  Fad<double>::Fad<double,_nullptr>
            ((Fad<double> *)in_stack_fffffffffffffcb0,&in_stack_fffffffffffffca8->val_);
  for (local_1e4 = 0; local_1e4 < 3; local_1e4 = local_1e4 + 1) {
    in_stack_fffffffffffffcb0 =
         (TPZManVector<Fad<double>,_3> *)TPZVec<Fad<double>_>::operator[](local_a0,(long)local_1e4);
    in_stack_fffffffffffffcb8 =
         (FadExpr<FadFuncSqrt<Fad<double>_>_> *)
         TPZVec<double>::operator[](&local_1b8,(long)local_1e4);
    operator-<Fad<double>,_double,_nullptr>(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
    TPZVec<Fad<double>_>::operator[]((TPZVec<Fad<double>_> *)local_158,(long)local_1e4);
    Fad<double>::operator=
              (in_RDI,(FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_> *)
                      in_stack_fffffffffffffcb8);
    FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMinus<Fad<double>,_FadCst<double>_>_> *)in_stack_fffffffffffffca0);
    in_stack_fffffffffffffca0 = local_158;
    in_stack_fffffffffffffca8 =
         TPZVec<Fad<double>_>::operator[]
                   ((TPZVec<Fad<double>_> *)in_stack_fffffffffffffca0,(long)local_1e4);
    TPZVec<Fad<double>_>::operator[]
              ((TPZVec<Fad<double>_> *)in_stack_fffffffffffffca0,(long)local_1e4);
    operator*<Fad<double>,_Fad<double>,_nullptr>
              ((Fad<double> *)in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
    Fad<double>::operator+=(in_stack_fffffffffffffcd0,x);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_fffffffffffffca0);
  }
  sqrt<double>((Fad<double> *)in_stack_fffffffffffffcd8);
  Fad<double>::operator=(in_RDI,in_stack_fffffffffffffcb8);
  FadExpr<FadFuncSqrt<Fad<double>_>_>::~FadExpr
            ((FadExpr<FadFuncSqrt<Fad<double>_>_> *)in_stack_fffffffffffffca0);
  Fad<double>::Fad<double,_nullptr>
            ((Fad<double> *)in_stack_fffffffffffffcb0,&in_stack_fffffffffffffca8->val_);
  TPZManVector<Fad<double>,_3>::TPZManVector
            (in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffffca0);
  for (local_2e4 = 0; local_2e4 < 3; local_2e4 = local_2e4 + 1) {
    operator/<double,_Fad<double>,_nullptr>
              (in_stack_fffffffffffffce8,(Fad<double> *)in_stack_fffffffffffffce0);
    TPZVec<Fad<double>_>::operator[]((TPZVec<Fad<double>_> *)local_158,(long)local_2e4);
    operator*<FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
              ((FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffffcd8,
               in_stack_fffffffffffffcd0);
    TPZVec<double>::operator[](&local_1b8,(long)local_2e4);
    operator+<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_double,_nullptr>
              ((FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
                *)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
    TPZVec<Fad<double>_>::operator[](local_20,(long)local_2e4);
    Fad<double>::operator=
              (in_RDI,(FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
                       *)in_stack_fffffffffffffcb8);
    FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
    ::~FadExpr((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
                *)in_stack_fffffffffffffca0);
    FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>::
    ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_>,_Fad<double>_>_>
              *)in_stack_fffffffffffffca0);
    FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryDiv<FadCst<double>,_Fad<double>_>_> *)in_stack_fffffffffffffca0);
  }
  TPZManVector<Fad<double>,_3>::~TPZManVector(in_stack_fffffffffffffcb0);
  Fad<double>::~Fad((Fad<double> *)in_stack_fffffffffffffca0);
  TPZManVector<double,_3>::~TPZManVector(in_stack_fffffffffffffca0);
  TPZManVector<Fad<double>,_3>::~TPZManVector(in_stack_fffffffffffffcb0);
  TPZManVector<Fad<double>,_3>::~TPZManVector(in_stack_fffffffffffffcb0);
  return;
}

Assistant:

void X(TPZFMatrix<REAL> &cornerco,TPZVec<T> &loc,TPZVec<T> &result) const
        {
//            TPZFNMatrix<3*NNodes> coord(3,NNodes);
//            CornerCoordinates(gel, coord);
//            X(coord,loc,result);
            
            
            TPZManVector<T,3> xqsi(3,0.); // will store (x,y,z) from (qsi,eta)
            TPZManVector<T,3> XtminusXc(3,0.0); // will store (x,y,z)-xc
            GeomTriang::X(cornerco,loc,xqsi);
            TPZManVector<REAL,3> Xc = fXc;
            
            T NormValue = 0.0;
            
            for (int i = 0; i < 3; i++) {
                XtminusXc[i] = xqsi[i] - Xc[i];
                NormValue += XtminusXc[i]*XtminusXc[i];
            }
            
//            XtminusXc[0,0)= xqsi[0] - Xc[0];
//            XtminusXc(1,0)= xqsi[1] - Xc[1];
//            XtminusXc(2,0)= xqsi[2] - Xc[2];
            
            NormValue = sqrt(NormValue);
            
            TPZManVector<T,3> Xsphere(3,0.0);
            for(int i=0; i<3; i++)
            {
                result[i] = (fR/NormValue)*(XtminusXc[i])+ Xc[i];
            }
//            Xsphere[0] = (fR/NormValue)*(XtminusXc(0,0)+Xc[0]);
//            Xsphere[1] = (fR/NormValue)*(XtminusXc(1,0)+Xc[1]);
//            Xsphere[2] = (fR/NormValue)*(XtminusXc(2,0)+Xc[2]);		
//            result=Xsphere;
            
            
        }